

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O0

void __thiscall
GenericModelPrivate::moveRowsSameParent
          (GenericModelPrivate *this,QModelIndex *sourceParent,int sourceRow,int count,
          int destinationChild)

{
  GenericModelItem *this_00;
  enable_if_t<std::is_integral_v<int>,_iterator>_conflict __first;
  QMap<int,_QVariant> *local_68;
  QMap<int,_QVariant> *local_60;
  enable_if_t<std::is_integral_v<int>,_iterator>_conflict destination;
  QMap<int,_QVariant> *local_50;
  iterator local_48;
  enable_if_t<std::is_integral_v<int>,_iterator>_conflict sourceEnd;
  enable_if_t<std::is_integral_v<int>,_iterator>_conflict sourceBegin;
  GenericModelItem *item;
  int destinationChild_local;
  int count_local;
  int sourceRow_local;
  QModelIndex *sourceParent_local;
  GenericModelPrivate *this_local;
  
  this_00 = itemForIndex(this,sourceParent);
  GenericModelItem::moveChildRows(this_00,sourceRow,count,destinationChild);
  if (this_00 == this->root) {
    sourceEnd.i = (QMap<int,_QVariant> *)QList<QMap<int,_QVariant>_>::begin(&this->vHeaderData);
    __first = QList<QMap<int,QVariant>>::iterator::operator+((iterator *)&sourceEnd,sourceRow);
    destination.i = (QMap<int,_QVariant> *)QList<QMap<int,_QVariant>_>::begin(&this->vHeaderData);
    local_50 = (QMap<int,_QVariant> *)
               QList<QMap<int,QVariant>>::iterator::operator+((iterator *)&destination,sourceRow);
    local_48.i = (QMap<int,_QVariant> *)
                 QList<QMap<int,QVariant>>::iterator::operator+((iterator *)&local_50,count);
    local_68 = (QMap<int,_QVariant> *)QList<QMap<int,_QVariant>_>::begin(&this->vHeaderData);
    local_60 = (QMap<int,_QVariant> *)
               QList<QMap<int,QVariant>>::iterator::operator+
                         ((iterator *)&local_68,destinationChild);
    if (destinationChild < sourceRow) {
      std::_V2::rotate<QList<QMap<int,QVariant>>::iterator>
                ((iterator)local_60,(iterator)__first.i,local_48);
    }
    else {
      std::_V2::rotate<QList<QMap<int,QVariant>>::iterator>
                ((iterator)__first.i,local_48,(iterator)local_60);
    }
  }
  return;
}

Assistant:

void GenericModelPrivate::moveRowsSameParent(const QModelIndex &sourceParent, int sourceRow, int count, int destinationChild)
{
    GenericModelItem *item = itemForIndex(sourceParent);
    item->moveChildRows(sourceRow, count, destinationChild);
    if (item == root) {
        const auto sourceBegin = vHeaderData.begin() + sourceRow;
        const auto sourceEnd = vHeaderData.begin() + sourceRow + count;
        const auto destination = vHeaderData.begin() + destinationChild;
        if (destinationChild < sourceRow)
            std::rotate(destination, sourceBegin, sourceEnd);
        else
            std::rotate(sourceBegin, sourceEnd, destination);
    }
}